

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamEntry::restoreXml(ParamEntry *this,Element *el,AddrSpaceManager *manage,bool normalstack)

{
  long lVar1;
  bool bVar2;
  int4 iVar3;
  type_metatype tVar4;
  _Ios_Fmtflags _Var5;
  string *psVar6;
  LowlevelError *pLVar7;
  List *this_00;
  reference ppEVar8;
  AddrSpace *pAVar9;
  uintb uVar10;
  allocator local_a31;
  string local_a30 [38];
  undefined1 local_a0a;
  allocator local_a09;
  string local_a08 [32];
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_9e8
  ;
  Address local_9e0;
  undefined1 local_9d0 [8];
  Address addr;
  string local_9b8 [39];
  undefined1 local_991;
  string local_990 [38];
  undefined1 local_96a;
  allocator local_969;
  string local_968 [32];
  long local_948;
  istringstream i6;
  long local_7c8;
  istringstream i5;
  long local_648;
  istringstream i3;
  long local_4c8;
  istringstream i4;
  long local_348;
  istringstream i2;
  long local_1b8;
  istringstream i1;
  string *attrname;
  int4 i;
  int4 num;
  bool normalstack_local;
  AddrSpaceManager *manage_local;
  Element *el_local;
  ParamEntry *this_local;
  
  this->flags = 0;
  this->type = TYPE_UNKNOWN;
  this->minsize = -1;
  this->size = -1;
  this->alignment = 0;
  this->numslots = 1;
  this->groupsize = 1;
  iVar3 = Element::getNumAttributes(el);
  for (attrname._4_4_ = 0; attrname._4_4_ < iVar3; attrname._4_4_ = attrname._4_4_ + 1) {
    psVar6 = Element::getAttributeName_abi_cxx11_(el,attrname._4_4_);
    bVar2 = std::operator==(psVar6,"minsize");
    if (bVar2) {
      psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
      std::__cxx11::istringstream::istringstream((istringstream *)&local_1b8,psVar6);
      lVar1 = *(long *)(local_1b8 + -0x18);
      _Var5 = std::operator|(_S_dec,_S_hex);
      _Var5 = std::operator|(_Var5,_S_oct);
      std::ios_base::unsetf((ios_base *)((long)&local_1b8 + lVar1),_Var5);
      std::istream::operator>>(&local_1b8,&this->minsize);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b8);
    }
    else {
      bVar2 = std::operator==(psVar6,"size");
      if (bVar2) {
        psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
        std::__cxx11::istringstream::istringstream((istringstream *)&local_348,psVar6);
        lVar1 = *(long *)(local_348 + -0x18);
        _Var5 = std::operator|(_S_dec,_S_hex);
        _Var5 = std::operator|(_Var5,_S_oct);
        std::ios_base::unsetf((ios_base *)((long)&local_348 + lVar1),_Var5);
        std::istream::operator>>(&local_348,&this->alignment);
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_348);
      }
      else {
        bVar2 = std::operator==(psVar6,"align");
        if (bVar2) {
          psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
          std::__cxx11::istringstream::istringstream((istringstream *)&local_4c8,psVar6);
          lVar1 = *(long *)(local_4c8 + -0x18);
          _Var5 = std::operator|(_S_dec,_S_hex);
          _Var5 = std::operator|(_Var5,_S_oct);
          std::ios_base::unsetf((ios_base *)((long)&local_4c8 + lVar1),_Var5);
          std::istream::operator>>(&local_4c8,&this->alignment);
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_4c8);
        }
        else {
          bVar2 = std::operator==(psVar6,"maxsize");
          if (bVar2) {
            psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
            std::__cxx11::istringstream::istringstream((istringstream *)&local_648,psVar6);
            lVar1 = *(long *)(local_648 + -0x18);
            _Var5 = std::operator|(_S_dec,_S_hex);
            _Var5 = std::operator|(_Var5,_S_oct);
            std::ios_base::unsetf((ios_base *)((long)&local_648 + lVar1),_Var5);
            std::istream::operator>>(&local_648,&this->size);
            std::__cxx11::istringstream::~istringstream((istringstream *)&local_648);
          }
          else {
            bVar2 = std::operator==(psVar6,"metatype");
            if (bVar2) {
              psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
              tVar4 = string2metatype(psVar6);
              this->type = tVar4;
            }
            else {
              bVar2 = std::operator==(psVar6,"group");
              if (bVar2) {
                psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                std::__cxx11::istringstream::istringstream((istringstream *)&local_7c8,psVar6);
                lVar1 = *(long *)(local_7c8 + -0x18);
                _Var5 = std::operator|(_S_dec,_S_hex);
                _Var5 = std::operator|(_Var5,_S_oct);
                std::ios_base::unsetf((ios_base *)((long)&local_7c8 + lVar1),_Var5);
                std::istream::operator>>(&local_7c8,&this->group);
                std::__cxx11::istringstream::~istringstream((istringstream *)&local_7c8);
              }
              else {
                bVar2 = std::operator==(psVar6,"groupsize");
                if (bVar2) {
                  psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                  std::__cxx11::istringstream::istringstream((istringstream *)&local_948,psVar6);
                  lVar1 = *(long *)(local_948 + -0x18);
                  _Var5 = std::operator|(_S_dec,_S_hex);
                  _Var5 = std::operator|(_Var5,_S_oct);
                  std::ios_base::unsetf((ios_base *)((long)&local_948 + lVar1),_Var5);
                  std::istream::operator>>(&local_948,&this->groupsize);
                  std::__cxx11::istringstream::~istringstream((istringstream *)&local_948);
                }
                else {
                  bVar2 = std::operator==(psVar6,"extension");
                  if (!bVar2) {
                    local_991 = 1;
                    pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
                    std::operator+((char *)local_990,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Unknown ParamEntry attribute: ");
                    LowlevelError::LowlevelError(pLVar7,local_990);
                    local_991 = 0;
                    __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
                  }
                  this->flags = this->flags & 0xffffffd3;
                  psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                  bVar2 = std::operator==(psVar6,"sign");
                  if (bVar2) {
                    this->flags = this->flags | 8;
                  }
                  else {
                    psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                    bVar2 = std::operator==(psVar6,"zero");
                    if (bVar2) {
                      this->flags = this->flags | 4;
                    }
                    else {
                      psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                      bVar2 = std::operator==(psVar6,"inttype");
                      if (bVar2) {
                        this->flags = this->flags | 0x20;
                      }
                      else {
                        psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                        bVar2 = std::operator==(psVar6,"float");
                        if (bVar2) {
                          this->flags = this->flags | 0x40;
                        }
                        else {
                          psVar6 = Element::getAttributeValue_abi_cxx11_(el,attrname._4_4_);
                          bVar2 = std::operator!=(psVar6,"none");
                          if (bVar2) {
                            local_96a = 1;
                            pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_968,"Bad extension attribute",&local_969);
                            LowlevelError::LowlevelError(pLVar7,(string *)local_968);
                            local_96a = 0;
                            __cxa_throw(pLVar7,&LowlevelError::typeinfo,
                                        LowlevelError::~LowlevelError);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((this->size == -1) || (this->minsize == -1)) {
    addr.offset._6_1_ = 1;
    pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_9b8,"ParamEntry not fully specified",(allocator *)((long)&addr.offset + 7));
    LowlevelError::LowlevelError(pLVar7,(string *)local_9b8);
    addr.offset._6_1_ = 0;
    __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (this->alignment == this->size) {
    this->alignment = 0;
  }
  Address::Address((Address *)local_9d0);
  this_00 = Element::getChildren(el);
  local_9e8._M_current =
       (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(this_00);
  ppEVar8 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_9e8);
  Address::restoreXml(&local_9e0,*ppEVar8,manage);
  Address::operator=((Address *)local_9d0,&local_9e0);
  pAVar9 = Address::getSpace((Address *)local_9d0);
  this->spaceid = pAVar9;
  uVar10 = Address::getOffset((Address *)local_9d0);
  this->addressbase = uVar10;
  if (this->alignment != 0) {
    this->numslots = this->size / this->alignment;
  }
  bVar2 = AddrSpace::isReverseJustified(this->spaceid);
  if (bVar2) {
    bVar2 = AddrSpace::isBigEndian(this->spaceid);
    if (!bVar2) {
      local_a0a = 1;
      pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a08,"No support for right justification in little endian encoding",&local_a09
                );
      LowlevelError::LowlevelError(pLVar7,(string *)local_a08);
      local_a0a = 0;
      __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    this->flags = this->flags | 1;
  }
  if (((!normalstack) && (this->flags = this->flags | 2, this->alignment != 0)) &&
     (this->size % this->alignment != 0)) {
    pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a30,"For positive stack growth, <pentry> size must match alignment",&local_a31)
    ;
    LowlevelError::LowlevelError(pLVar7,(string *)local_a30);
    __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  resolveJoin(this);
  return;
}

Assistant:

void ParamEntry::restoreXml(const Element *el,const AddrSpaceManager *manage,bool normalstack)

{
  flags = 0;
  type = TYPE_UNKNOWN;
  size = minsize = -1;		// Must be filled in
  alignment = 0;		// default
  numslots = 1;
  groupsize = 1;		// default
  int4 num = el->getNumAttributes();
  
  for(int4 i=0;i<num;++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname=="minsize") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> minsize;
    }
    else if (attrname == "size") { // old style
      istringstream i2(el->getAttributeValue(i));
      i2.unsetf(ios::dec | ios::hex | ios::oct);
      i2 >> alignment;
    }
    else if (attrname == "align") { // new style
      istringstream i4(el->getAttributeValue(i));
      i4.unsetf(ios::dec | ios::hex | ios::oct);
      i4 >> alignment;
    }
    else if (attrname == "maxsize") {
      istringstream i3(el->getAttributeValue(i));
      i3.unsetf(ios::dec | ios::hex | ios::oct);
      i3 >> size;
    }
    else if (attrname == "metatype")
      type = string2metatype(el->getAttributeValue(i));
    else if (attrname == "group") { // Override the group
      istringstream i5(el->getAttributeValue(i));
      i5.unsetf(ios::dec | ios::hex | ios::oct);
      i5 >> group;
    }
    else if (attrname == "groupsize") {
      istringstream i6(el->getAttributeValue(i));
      i6.unsetf(ios::dec | ios::hex | ios::oct);
      i6 >> groupsize;
    }
    else if (attrname == "extension") {
      flags &= ~((uint4)(smallsize_zext | smallsize_sext | smallsize_inttype));
      if (el->getAttributeValue(i) == "sign")
	flags |= smallsize_sext;
      else if (el->getAttributeValue(i) == "zero")
	flags |= smallsize_zext;
      else if (el->getAttributeValue(i) == "inttype")
	flags |= smallsize_inttype;
      else if (el->getAttributeValue(i) == "float")
	flags |= smallsize_floatext;
      else if (el->getAttributeValue(i) != "none")
	throw LowlevelError("Bad extension attribute");
    }
    else
      throw LowlevelError("Unknown ParamEntry attribute: "+attrname);
  }
  if ((size==-1)||(minsize==-1))
    throw LowlevelError("ParamEntry not fully specified");
  if (alignment == size)
    alignment = 0;
  Address addr;
  addr = Address::restoreXml( *el->getChildren().begin(),manage);
  spaceid = addr.getSpace();
  addressbase = addr.getOffset();
  if (alignment != 0) {
//    if ((addressbase % alignment) != 0)
//      throw LowlevelError("Stack <pentry> address must match alignment");
    numslots = size / alignment;
  }
  if (spaceid->isReverseJustified()) {
    if (spaceid->isBigEndian())
      flags |= force_left_justify;
    else
      throw LowlevelError("No support for right justification in little endian encoding");
  }
  if (!normalstack) {
    flags |= reverse_stack;
    if (alignment != 0) {
      if ((size % alignment) != 0)
	throw LowlevelError("For positive stack growth, <pentry> size must match alignment");
    }
  }
  resolveJoin();
}